

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

Option_group * __thiscall
CLI::App::add_option_group<CLI::Option_group>
          (App *this,string *group_name,string *group_description)

{
  bool bVar1;
  IncorrectConstruction *this_00;
  shared_ptr<CLI::Option_group> option_group;
  App_p app_ptr;
  App_p local_58;
  string local_48;
  
  bVar1 = detail::valid_alias_name_string(group_name);
  if (bVar1) {
    app_ptr.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
    ::std::make_shared<CLI::Option_group,std::__cxx11::string,std::__cxx11::string&,CLI::App*>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&option_group,
               group_description,(App **)group_name);
    ::std::dynamic_pointer_cast<CLI::App,CLI::Option_group>
              ((shared_ptr<CLI::Option_group> *)&app_ptr);
    local_58.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         app_ptr.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_58.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         app_ptr.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    app_ptr.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    app_ptr.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    add_subcommand(this,&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_58.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&app_ptr.super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&option_group.super___shared_ptr<CLI::Option_group,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    return option_group.super___shared_ptr<CLI::Option_group,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  this_00 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"option group names may not contain newlines or null characters",
             (allocator<char> *)&option_group);
  IncorrectConstruction::IncorrectConstruction(this_00,&local_48);
  __cxa_throw(this_00,&IncorrectConstruction::typeinfo,Error::~Error);
}

Assistant:

T *add_option_group(std::string group_name, std::string group_description = "") {
        if(!detail::valid_alias_name_string(group_name)) {
            throw IncorrectConstruction("option group names may not contain newlines or null characters");
        }
        auto option_group = std::make_shared<T>(std::move(group_description), group_name, this);
        auto *ptr = option_group.get();
        // move to App_p for overload resolution on older gcc versions
        App_p app_ptr = std::dynamic_pointer_cast<App>(option_group);
        add_subcommand(std::move(app_ptr));
        return ptr;
    }